

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void __thiscall testing::TestSuite::Run(TestSuite *this)

{
  TestEventRepeater *pTVar1;
  pointer piVar2;
  UnitTestImpl *pUVar3;
  OsStackTraceGetterInterface *pOVar4;
  pointer ppTVar5;
  uint uVar6;
  long lVar7;
  undefined1 local_38 [8];
  timeval now;
  
  if (this->should_run_ == true) {
    UnitTest::GetInstance();
    pUVar3 = UnitTest::GetInstance::instance.impl_;
    (UnitTest::GetInstance::instance.impl_)->current_test_suite_ = this;
    UnitTest::GetInstance();
    pTVar1 = ((UnitTest::GetInstance::instance.impl_)->listeners_).repeater_;
    (*(pTVar1->super_TestEventListener)._vptr_TestEventListener[6])(pTVar1,this);
    (*(pTVar1->super_TestEventListener)._vptr_TestEventListener[7])(pTVar1,this);
    if (pUVar3->os_stack_trace_getter_ == (OsStackTraceGetterInterface *)0x0) {
      pOVar4 = (OsStackTraceGetterInterface *)operator_new(8);
      pOVar4->_vptr_OsStackTraceGetterInterface =
           (_func_int **)&PTR__OsStackTraceGetterInterface_0015a3e8;
      pUVar3->os_stack_trace_getter_ = pOVar4;
    }
    (*pUVar3->os_stack_trace_getter_->_vptr_OsStackTraceGetterInterface[3])();
    internal::HandleExceptionsInMethodIfSupported<testing::TestSuite,void>
              (this,0x13ad94,(char *)0x0);
    gettimeofday((timeval *)local_38,(__timezone_ptr_t)0x0);
    this->start_timestamp_ = now.tv_sec / 1000 + (long)local_38 * 1000;
    ppTVar5 = (this->test_info_list_).
              super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (0 < (int)((ulong)((long)(this->test_info_list_).
                                super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar5) >> 3)) {
      lVar7 = 0;
      do {
        piVar2 = (this->test_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar6 = 0xffffffff;
        if (lVar7 < (int)((ulong)((long)(this->test_indices_).
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_finish - (long)piVar2) >> 2)) {
          uVar6 = piVar2[lVar7];
        }
        TestInfo::Run(ppTVar5[uVar6]);
        lVar7 = lVar7 + 1;
        ppTVar5 = (this->test_info_list_).
                  super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      } while (lVar7 < (int)((ulong)((long)(this->test_info_list_).
                                           super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)ppTVar5) >> 3));
    }
    gettimeofday((timeval *)local_38,(__timezone_ptr_t)0x0);
    this->elapsed_time_ = (now.tv_sec / 1000 + (long)local_38 * 1000) - this->start_timestamp_;
    if (pUVar3->os_stack_trace_getter_ == (OsStackTraceGetterInterface *)0x0) {
      pOVar4 = (OsStackTraceGetterInterface *)operator_new(8);
      pOVar4->_vptr_OsStackTraceGetterInterface =
           (_func_int **)&PTR__OsStackTraceGetterInterface_0015a3e8;
      pUVar3->os_stack_trace_getter_ = pOVar4;
    }
    (*pUVar3->os_stack_trace_getter_->_vptr_OsStackTraceGetterInterface[3])();
    internal::HandleExceptionsInMethodIfSupported<testing::TestSuite,void>
              (this,0x13ada6,(char *)0x0);
    (*(pTVar1->super_TestEventListener)._vptr_TestEventListener[0xb])(pTVar1,this);
    (*(pTVar1->super_TestEventListener)._vptr_TestEventListener[0xc])(pTVar1,this);
    pUVar3->current_test_suite_ = (TestSuite *)0x0;
  }
  return;
}

Assistant:

void TestSuite::Run() {
  if (!should_run_) return;

  internal::UnitTestImpl* const impl = internal::GetUnitTestImpl();
  impl->set_current_test_suite(this);

  TestEventListener* repeater = UnitTest::GetInstance()->listeners().repeater();

  // Call both legacy and the new API
  repeater->OnTestSuiteStart(*this);
//  Legacy API is deprecated but still available
#ifndef GTEST_REMOVE_LEGACY_TEST_CASEAPI
  repeater->OnTestCaseStart(*this);
#endif  //  GTEST_REMOVE_LEGACY_TEST_CASEAPI

  impl->os_stack_trace_getter()->UponLeavingGTest();
  internal::HandleExceptionsInMethodIfSupported(
      this, &TestSuite::RunSetUpTestSuite, "SetUpTestSuite()");

  start_timestamp_ = internal::GetTimeInMillis();
  for (int i = 0; i < total_test_count(); i++) {
    GetMutableTestInfo(i)->Run();
  }
  elapsed_time_ = internal::GetTimeInMillis() - start_timestamp_;

  impl->os_stack_trace_getter()->UponLeavingGTest();
  internal::HandleExceptionsInMethodIfSupported(
      this, &TestSuite::RunTearDownTestSuite, "TearDownTestSuite()");

  // Call both legacy and the new API
  repeater->OnTestSuiteEnd(*this);
//  Legacy API is deprecated but still available
#ifndef GTEST_REMOVE_LEGACY_TEST_CASEAPI
  repeater->OnTestCaseEnd(*this);
#endif  //  GTEST_REMOVE_LEGACY_TEST_CASEAPI

  impl->set_current_test_suite(nullptr);
}